

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_op6_mips(TCGContext_conflict3 *tcg_ctx,TCGOpcode opc,TCGArg a1,TCGArg a2,TCGArg a3,
                     TCGArg a4,TCGArg a5,TCGArg a6)

{
  TCGOp *pTVar1;
  TCGOp *op;
  TCGArg a4_local;
  TCGArg a3_local;
  TCGArg a2_local;
  TCGArg a1_local;
  TCGOpcode opc_local;
  TCGContext_conflict3 *tcg_ctx_local;
  
  pTVar1 = tcg_emit_op_mips(tcg_ctx,opc);
  pTVar1->args[0] = a1;
  pTVar1->args[1] = a2;
  pTVar1->args[2] = a3;
  pTVar1->args[3] = a4;
  pTVar1->args[4] = a5;
  pTVar1->args[5] = a6;
  return;
}

Assistant:

void tcg_gen_op6(TCGContext *tcg_ctx, TCGOpcode opc, TCGArg a1, TCGArg a2, TCGArg a3,
                 TCGArg a4, TCGArg a5, TCGArg a6)
{
    TCGOp *op = tcg_emit_op(tcg_ctx, opc);
    op->args[0] = a1;
    op->args[1] = a2;
    op->args[2] = a3;
    op->args[3] = a4;
    op->args[4] = a5;
    op->args[5] = a6;
}